

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>>>
::
padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>>>::int_writer<unsigned_int,fmt::v5::basic_format_specs<fmt::v5::char8_t>>::hex_writer>
::operator()(padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>>>::int_writer<unsigned_int,fmt::v5::basic_format_specs<fmt::v5::char8_t>>::hex_writer>
             *this,char8_t **it)

{
  long lVar1;
  long lVar2;
  long lVar3;
  char8_t *pcVar4;
  
  lVar1 = *(long *)(this + 0x10);
  pcVar4 = *it;
  if (lVar1 != 0) {
    lVar2 = *(long *)(this + 8);
    for (lVar3 = 0; lVar1 != lVar3; lVar3 = lVar3 + 1) {
      pcVar4[lVar3] = *(char8_t *)(lVar2 + lVar3);
    }
    pcVar4 = pcVar4 + lVar3;
    *it = pcVar4;
  }
  pcVar4 = std::__fill_n_a<fmt::v5::char8_t*,unsigned_long,fmt::v5::char8_t>
                     (pcVar4,*(undefined8 *)(this + 0x20),this + 0x18);
  *it = pcVar4;
  int_writer<unsigned_int,fmt::v5::basic_format_specs<fmt::v5::char8_t>>::hex_writer::operator()
            ((hex_writer *)(this + 0x28),it);
  return;
}

Assistant:

void operator()(It &&it) const {
      if (prefix.size() != 0)
        it = internal::copy_str<char_type>(prefix.begin(), prefix.end(), it);
      it = std::fill_n(it, padding, fill);
      f(it);
    }